

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

int ws_get_recv_text(void *arg,void *buf,size_t *szp,nni_type t)

{
  _Bool b;
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  b = *(_Bool *)((long)arg + 0x58);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  iVar1 = nni_copyout_bool(b,buf,szp,t);
  return iVar1;
}

Assistant:

static int
ws_get_recv_text(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_ws *ws = arg;
	bool    b;
	nni_mtx_lock(&ws->mtx);
	b = ws->recv_text;
	nni_mtx_unlock(&ws->mtx);

	return (nni_copyout_bool(b, buf, szp, t));
}